

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O1

int __thiscall libtorrent::setting_by_name(libtorrent *this,string_view key)

{
  char *pcVar1;
  int iVar2;
  libtorrent *plVar3;
  size_type __rlen;
  undefined **ppuVar4;
  void *__s1;
  undefined8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  __s1 = (void *)key._M_len;
  puVar5 = &(anonymous_namespace)::str_settings;
  uVar6 = 0;
  bVar8 = false;
  do {
    pcVar1 = (char *)*puVar5;
    plVar3 = (libtorrent *)strlen(pcVar1);
    if ((plVar3 == this) &&
       ((this == (libtorrent *)0x0 || (iVar2 = bcmp(__s1,pcVar1,(size_t)this), iVar2 == 0)))) {
      if (!bVar8) goto LAB_002fff7c;
      goto LAB_002ffe83;
    }
    bVar8 = 0xb < uVar6;
    uVar6 = uVar6 + 1;
    puVar5 = puVar5 + 7;
  } while (uVar6 != 0xd);
  uVar6 = 0xd;
LAB_002ffe83:
  ppuVar4 = &(anonymous_namespace)::int_settings;
  uVar7 = 0;
  bVar8 = false;
  do {
    pcVar1 = *ppuVar4;
    plVar3 = (libtorrent *)strlen(pcVar1);
    if ((plVar3 == this) &&
       ((this == (libtorrent *)0x0 || (iVar2 = bcmp(__s1,pcVar1,(size_t)this), iVar2 == 0)))) {
      uVar6 = (ulong)((int)uVar7 + 0x4000);
      break;
    }
    bVar8 = 0x9d < uVar7;
    uVar7 = uVar7 + 1;
    ppuVar4 = ppuVar4 + 4;
  } while (uVar7 != 0x9f);
  if (bVar8) {
    ppuVar4 = &(anonymous_namespace)::bool_settings;
    uVar7 = 0;
    bVar8 = false;
    do {
      pcVar1 = *ppuVar4;
      plVar3 = (libtorrent *)strlen(pcVar1);
      if ((plVar3 == this) &&
         ((this == (libtorrent *)0x0 || (iVar2 = bcmp(__s1,pcVar1,(size_t)this), iVar2 == 0)))) {
        uVar6 = (ulong)((int)uVar7 + 0x8000);
        break;
      }
      bVar8 = 0x52 < uVar7;
      uVar7 = uVar7 + 1;
      ppuVar4 = ppuVar4 + 4;
    } while (uVar7 != 0x54);
    if ((bVar8) && (uVar6 = 0xffffffff, this == (libtorrent *)0x8)) {
      iVar2 = bcmp(__s1,"peer_tos",8);
      uVar6 = (ulong)(-(uint)(iVar2 != 0) | 0x4028);
    }
  }
LAB_002fff7c:
  return (int)uVar6;
}

Assistant:

int setting_by_name(string_view const key)
	{
		for (int k = 0; k < str_settings.end_index(); ++k)
		{
			if (key != str_settings[k].name) continue;
			return settings_pack::string_type_base + k;
		}
		for (int k = 0; k < int_settings.end_index(); ++k)
		{
			if (key != int_settings[k].name) continue;
			return settings_pack::int_type_base + k;
		}
		for (int k = 0; k < bool_settings.end_index(); ++k)
		{
			if (key != bool_settings[k].name) continue;
			return settings_pack::bool_type_base + k;
		}

		// backwards compatibility with previous name
		if (key == "peer_tos")
			return settings_pack::peer_dscp;

		return -1;
	}